

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QHttpNetworkReply::ignoreSslErrors(QHttpNetworkReply *this)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x168));
  if (bVar2) {
    QHttpNetworkConnection::ignoreSslErrors(*(QHttpNetworkConnection **)(lVar1 + 0x170),-1);
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }